

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_solver_utilities.cpp
# Opt level: O1

void __thiscall
solver_utilites_update_convergence_Test::TestBody(solver_utilites_update_convergence_Test *this)

{
  size_t *lhs;
  pointer pdVar1;
  pointer pdVar2;
  Scalar *pSVar3;
  long lVar4;
  pointer *__ptr;
  char *pcVar5;
  pair<double,_double> pVar6;
  AssertionResult gtest_ar_10;
  AssertionResult gtest_ar_2;
  Vector_Dense<double,_0UL> solution;
  Vector_Dense<double,_0UL> constant;
  time_point start_time;
  Matrix_Sparse matrix_sparse;
  Convergence_Data data;
  undefined1 local_188 [8];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbStack_180;
  pointer pdStack_178;
  initializer_list<double> local_170;
  AssertHelper local_160;
  undefined1 local_158 [8];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbStack_150;
  pointer local_148;
  pointer puStack_140;
  pointer local_138;
  vector<double,_std::allocator<double>_> local_128;
  Vector_Dense<double,_0UL> local_108;
  double local_f0;
  double local_e8;
  time_point<std::chrono::_V2::steady_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>
  local_e0;
  undefined1 local_d8 [8];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbStack_d0;
  pointer local_c8;
  pointer local_c0;
  pointer puStack_b8;
  pointer local_b0;
  pointer pdStack_a8;
  pointer local_a0;
  pointer pdStack_98;
  size_t local_90;
  Convergence_Data local_80;
  
  local_e0.__d.__r = (duration)std::chrono::_V2::steady_clock::now();
  lhs = &local_80.iteration;
  local_80.converged = false;
  local_80.duration.__r = 0;
  local_80.start_time.__d.__r = (duration)std::chrono::_V2::steady_clock::now();
  local_80.iteration = 0;
  local_80.residual = 1.79769313486232e+308;
  local_80.residual_0 = 1.79769313486232e+308;
  local_80.residual_normalised = 1.79769313486232e+308;
  local_80.residual_max = 1.79769313486232e+308;
  local_80.residual_max_0 = 1.79769313486232e+308;
  local_80.residual_max_normalised = 1.79769313486232e+308;
  local_158 = (undefined1  [8])((ulong)(uint)local_158._4_4_ << 0x20);
  testing::internal::CmpHelperEQ<unsigned_long,int>
            ((internal *)local_d8,"data.iteration","0",lhs,(int *)local_158);
  if (local_d8[0] == (internal)0x0) {
    testing::Message::Message((Message *)local_158);
    if (pbStack_d0 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar5 = "";
    }
    else {
      pcVar5 = (pbStack_d0->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_128,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/bevanwsjones[P]Disa/test/solver/test_solver_utilities.cpp"
               ,0x21,pcVar5);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_128,(Message *)local_158);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_128);
    if (local_158 != (undefined1  [8])0x0) {
      (**(code **)(*(long *)local_158 + 8))();
    }
  }
  if (pbStack_d0 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&pbStack_d0,pbStack_d0);
  }
  testing::internal::
  CmpHelperGT<std::chrono::time_point<std::chrono::_V2::steady_clock,std::chrono::duration<long,std::ratio<1l,1000000000l>>>,std::chrono::time_point<std::chrono::_V2::steady_clock,std::chrono::duration<long,std::ratio<1l,1000000000l>>>>
            ((internal *)local_d8,"data.start_time","start_time",&local_80.start_time,&local_e0);
  if (local_d8[0] == (internal)0x0) {
    testing::Message::Message((Message *)local_158);
    if (pbStack_d0 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar5 = "";
    }
    else {
      pcVar5 = (pbStack_d0->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_128,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/bevanwsjones[P]Disa/test/solver/test_solver_utilities.cpp"
               ,0x22,pcVar5);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_128,(Message *)local_158);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_128);
    if (local_158 != (undefined1  [8])0x0) {
      (**(code **)(*(long *)local_158 + 8))();
    }
  }
  if (pbStack_d0 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&pbStack_d0,pbStack_d0);
  }
  local_c8 = (pointer)0x0;
  local_d8 = (undefined1  [8])0x0;
  pbStack_d0 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  local_d8 = (undefined1  [8])operator_new(0x30);
  pbStack_d0 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               ((long)local_d8 + 0x30);
  *(unsigned_long *)local_d8 = 0;
  *(unsigned_long *)((long)local_d8 + 8) = 0;
  *(unsigned_long *)((long)local_d8 + 0x10) = 0;
  *(unsigned_long *)((long)local_d8 + 0x18) = 0;
  *(unsigned_long *)((long)local_d8 + 0x20) = 0;
  *(unsigned_long *)((long)local_d8 + 0x28) = 0;
  local_a0 = (pointer)0x0;
  pdStack_98 = (pointer)0x0;
  local_b0 = (pointer)0x0;
  pdStack_a8 = (pointer)0x0;
  local_c0 = (pointer)0x0;
  puStack_b8 = (pointer)0x0;
  local_90 = 5;
  local_128.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x0;
  local_c8 = (pointer)pbStack_d0;
  Disa::Matrix_Sparse::operator[]((Matrix_Sparse *)local_158,(size_t *)local_d8);
  local_108.super_vector<double,_std::allocator<double>_>.
  super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data._M_start =
       (pointer)0x0;
  pSVar3 = Disa::Matrix_Sparse_Row<Disa::Matrix_Sparse>::operator[]<Disa::Matrix_Sparse,_true>
                     ((Matrix_Sparse_Row<Disa::Matrix_Sparse> *)local_158,(size_t *)&local_108);
  *pSVar3 = 0.5;
  local_128.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x1;
  Disa::Matrix_Sparse::operator[]((Matrix_Sparse *)local_158,(size_t *)local_d8);
  local_108.super_vector<double,_std::allocator<double>_>.
  super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data._M_start =
       (pointer)0x1;
  pSVar3 = Disa::Matrix_Sparse_Row<Disa::Matrix_Sparse>::operator[]<Disa::Matrix_Sparse,_true>
                     ((Matrix_Sparse_Row<Disa::Matrix_Sparse> *)local_158,(size_t *)&local_108);
  *pSVar3 = 0.5;
  local_128.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x2;
  Disa::Matrix_Sparse::operator[]((Matrix_Sparse *)local_158,(size_t *)local_d8);
  local_108.super_vector<double,_std::allocator<double>_>.
  super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data._M_start =
       (pointer)0x2;
  pSVar3 = Disa::Matrix_Sparse_Row<Disa::Matrix_Sparse>::operator[]<Disa::Matrix_Sparse,_true>
                     ((Matrix_Sparse_Row<Disa::Matrix_Sparse> *)local_158,(size_t *)&local_108);
  *pSVar3 = 0.5;
  local_128.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x3;
  Disa::Matrix_Sparse::operator[]((Matrix_Sparse *)local_158,(size_t *)local_d8);
  local_108.super_vector<double,_std::allocator<double>_>.
  super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data._M_start =
       (pointer)0x3;
  pSVar3 = Disa::Matrix_Sparse_Row<Disa::Matrix_Sparse>::operator[]<Disa::Matrix_Sparse,_true>
                     ((Matrix_Sparse_Row<Disa::Matrix_Sparse> *)local_158,(size_t *)&local_108);
  *pSVar3 = 0.5;
  local_128.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x4;
  Disa::Matrix_Sparse::operator[]((Matrix_Sparse *)local_158,(size_t *)local_d8);
  local_108.super_vector<double,_std::allocator<double>_>.
  super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data._M_start =
       (pointer)0x4;
  pSVar3 = Disa::Matrix_Sparse_Row<Disa::Matrix_Sparse>::operator[]<Disa::Matrix_Sparse,_true>
                     ((Matrix_Sparse_Row<Disa::Matrix_Sparse> *)local_158,(size_t *)&local_108);
  *pSVar3 = 0.5;
  local_128.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x0;
  local_128.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  local_128.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  local_158 = (undefined1  [8])0x4000000000000000;
  std::vector<double,_std::allocator<double>_>::resize
            (&local_128,5,(value_type_conflict2 *)local_158);
  local_148 = (pointer)0x4008000000000000;
  puStack_140 = (pointer)0xbff0000000000000;
  local_158 = (undefined1  [8])0x4008000000000000;
  pbStack_150 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                0xbff0000000000000;
  local_138 = (pointer)0x4008000000000000;
  pbStack_180 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x5;
  local_188 = (undefined1  [8])local_158;
  Disa::Vector_Dense<double,_0UL>::Vector_Dense(&local_108,(initializer_list<double> *)local_188);
  pVar6 = Disa::compute_residual<Disa::Matrix_Sparse,Disa::Vector_Dense<double,0ul>>
                    ((Matrix_Sparse *)local_d8,(Vector_Dense<double,_0UL> *)&local_128,&local_108);
  local_e8 = pVar6.second;
  local_f0 = pVar6.first;
  Disa::Convergence_Data::update<Disa::Matrix_Sparse,Disa::Vector_Dense<double,0ul>>
            (&local_80,(Matrix_Sparse *)local_d8,(Vector_Dense<double,_0UL> *)&local_128,&local_108)
  ;
  local_188._0_4_ = 1;
  testing::internal::CmpHelperEQ<unsigned_long,int>
            ((internal *)local_158,"data.iteration","1",lhs,(int *)local_188);
  if (local_158[0] == (internal)0x0) {
    testing::Message::Message((Message *)local_188);
    if (pbStack_150 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar5 = "";
    }
    else {
      pcVar5 = (pbStack_150->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_170,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/bevanwsjones[P]Disa/test/solver/test_solver_utilities.cpp"
               ,0x32,pcVar5);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_170,(Message *)local_188);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_170);
    if (local_188 != (undefined1  [8])0x0) {
      (**(code **)((long)*(double *)local_188 + 8))();
    }
  }
  if (pbStack_150 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&pbStack_150,pbStack_150);
  }
  lVar4 = std::chrono::_V2::steady_clock::now();
  local_188 = (undefined1  [8])((lVar4 - (long)local_e0.__d.__r) / 1000);
  testing::internal::
  CmpHelperLE<std::chrono::duration<long,std::ratio<1l,1000000l>>,std::chrono::duration<long,std::ratio<1l,1000000l>>>
            ((internal *)local_158,"data.duration",
             "std::chrono::duration_cast<std::chrono::microseconds>(std::chrono::steady_clock::now() - start_time)"
             ,&local_80.duration,(duration<long,_std::ratio<1L,_1000000L>_> *)local_188);
  if (local_158[0] == (internal)0x0) {
    testing::Message::Message((Message *)local_188);
    if (pbStack_150 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar5 = "";
    }
    else {
      pcVar5 = (pbStack_150->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_170,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/bevanwsjones[P]Disa/test/solver/test_solver_utilities.cpp"
               ,0x34,pcVar5);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_170,(Message *)local_188);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_170);
    if (local_188 != (undefined1  [8])0x0) {
      (**(code **)((long)*(double *)local_188 + 8))();
    }
  }
  if (pbStack_150 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&pbStack_150,pbStack_150);
  }
  testing::internal::CmpHelperEQ<double,double>
            ((internal *)local_158,"data.residual","weighted_l2_norm_0",&local_80.residual,&local_f0
            );
  if (local_158[0] == (internal)0x0) {
    testing::Message::Message((Message *)local_188);
    if (pbStack_150 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar5 = "";
    }
    else {
      pcVar5 = (pbStack_150->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_170,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/bevanwsjones[P]Disa/test/solver/test_solver_utilities.cpp"
               ,0x35,pcVar5);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_170,(Message *)local_188);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_170);
    if ((__uniq_ptr_data<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
         )local_188 !=
        (tuple<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         )0x0) {
      (**(code **)((long)*(double *)local_188 + 8))();
    }
  }
  if (pbStack_150 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&pbStack_150,pbStack_150);
  }
  testing::internal::CmpHelperEQ<double,double>
            ((internal *)local_158,"data.residual_max","l_inf_norm_0",&local_80.residual_max,
             &local_e8);
  if (local_158[0] == (internal)0x0) {
    testing::Message::Message((Message *)local_188);
    if (pbStack_150 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar5 = "";
    }
    else {
      pcVar5 = (pbStack_150->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_170,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/bevanwsjones[P]Disa/test/solver/test_solver_utilities.cpp"
               ,0x36,pcVar5);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_170,(Message *)local_188);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_170);
    if ((_Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         )local_188 !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      (**(code **)((long)*(double *)local_188 + 8))();
    }
  }
  if (pbStack_150 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&pbStack_150,pbStack_150);
  }
  testing::internal::CmpHelperEQ<double,double>
            ((internal *)local_158,"data.residual_0","weighted_l2_norm_0",&local_80.residual_0,
             &local_f0);
  if (local_158[0] == (internal)0x0) {
    testing::Message::Message((Message *)local_188);
    if (pbStack_150 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar5 = "";
    }
    else {
      pcVar5 = (pbStack_150->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_170,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/bevanwsjones[P]Disa/test/solver/test_solver_utilities.cpp"
               ,0x37,pcVar5);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_170,(Message *)local_188);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_170);
    if ((_Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         )local_188 !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      (**(code **)((long)*(double *)local_188 + 8))();
    }
  }
  if (pbStack_150 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&pbStack_150,pbStack_150);
  }
  testing::internal::CmpHelperEQ<double,double>
            ((internal *)local_158,"data.residual_max_0","l_inf_norm_0",&local_80.residual_max_0,
             &local_e8);
  if (local_158[0] == (internal)0x0) {
    testing::Message::Message((Message *)local_188);
    if (pbStack_150 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar5 = "";
    }
    else {
      pcVar5 = (pbStack_150->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_170,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/bevanwsjones[P]Disa/test/solver/test_solver_utilities.cpp"
               ,0x38,pcVar5);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_170,(Message *)local_188);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_170);
    if ((_Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         )local_188 !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      (**(code **)((long)*(double *)local_188 + 8))();
    }
  }
  if (pbStack_150 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&pbStack_150,pbStack_150);
  }
  local_188 = (undefined1  [8])0x3ff0000000000000;
  testing::internal::CmpHelperEQ<double,double>
            ((internal *)local_158,"data.residual_normalised","1.0",&local_80.residual_normalised,
             (double *)local_188);
  if (local_158[0] == (internal)0x0) {
    testing::Message::Message((Message *)local_188);
    if (pbStack_150 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar5 = "";
    }
    else {
      pcVar5 = (pbStack_150->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_170,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/bevanwsjones[P]Disa/test/solver/test_solver_utilities.cpp"
               ,0x39,pcVar5);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_170,(Message *)local_188);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_170);
    if (local_188 != (undefined1  [8])0x0) {
      (**(code **)((long)*(double *)local_188 + 8))();
    }
  }
  if (pbStack_150 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&pbStack_150,pbStack_150);
  }
  local_188 = (undefined1  [8])0x3ff0000000000000;
  testing::internal::CmpHelperEQ<double,double>
            ((internal *)local_158,"data.residual_max_normalised","1.0",
             &local_80.residual_max_normalised,(double *)local_188);
  if (local_158[0] == (internal)0x0) {
    testing::Message::Message((Message *)local_188);
    if (pbStack_150 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar5 = "";
    }
    else {
      pcVar5 = (pbStack_150->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_170,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/bevanwsjones[P]Disa/test/solver/test_solver_utilities.cpp"
               ,0x3a,pcVar5);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_170,(Message *)local_188);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_170);
    if (local_188 != (undefined1  [8])0x0) {
      (**(code **)((long)*(double *)local_188 + 8))();
    }
  }
  if (pbStack_150 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&pbStack_150,pbStack_150);
  }
  local_148 = (pointer)0x4008000000000000;
  puStack_140 = (pointer)0x0;
  local_158 = (undefined1  [8])0x4000000000000000;
  pbStack_150 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  local_138 = (pointer)0x4000000000000000;
  local_170._M_len = 5;
  local_170._M_array = (iterator)local_158;
  Disa::Vector_Dense<double,_0UL>::Vector_Dense((Vector_Dense<double,_0UL> *)local_188,&local_170);
  pdVar2 = local_108.super_vector<double,_std::allocator<double>_>.
           super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
           _M_end_of_storage;
  pdVar1 = local_108.super_vector<double,_std::allocator<double>_>.
           super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
           _M_start;
  local_108.super_vector<double,_std::allocator<double>_>.
  super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data._M_start =
       (pointer)local_188;
  local_108.super_vector<double,_std::allocator<double>_>.
  super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data._M_finish =
       (pointer)pbStack_180;
  local_108.super_vector<double,_std::allocator<double>_>.
  super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = pdStack_178;
  local_188 = (undefined1  [8])0x0;
  pbStack_180 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  pdStack_178 = (pointer)0x0;
  if (pdVar1 != (pointer)0x0) {
    operator_delete(pdVar1,(long)pdVar2 - (long)pdVar1);
  }
  if (local_188 != (undefined1  [8])0x0) {
    operator_delete((void *)local_188,(long)pdStack_178 - (long)local_188);
  }
  pVar6 = Disa::compute_residual<Disa::Matrix_Sparse,Disa::Vector_Dense<double,0ul>>
                    ((Matrix_Sparse *)local_d8,(Vector_Dense<double,_0UL> *)&local_128,&local_108);
  pbStack_150 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)pVar6.second;
  local_158 = (undefined1  [8])pVar6.first;
  Disa::Convergence_Data::update<Disa::Matrix_Sparse,Disa::Vector_Dense<double,0ul>>
            (&local_80,(Matrix_Sparse *)local_d8,(Vector_Dense<double,_0UL> *)&local_128,&local_108)
  ;
  local_170._M_array = (iterator)CONCAT44(local_170._M_array._4_4_,2);
  testing::internal::CmpHelperEQ<unsigned_long,int>
            ((internal *)local_188,"data.iteration","2",lhs,(int *)&local_170);
  if (local_188[0] == (internal)0x0) {
    testing::Message::Message((Message *)&local_170);
    if (pbStack_180 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar5 = "";
    }
    else {
      pcVar5 = (pbStack_180->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_160,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/bevanwsjones[P]Disa/test/solver/test_solver_utilities.cpp"
               ,0x41,pcVar5);
    testing::internal::AssertHelper::operator=(&local_160,(Message *)&local_170);
    testing::internal::AssertHelper::~AssertHelper(&local_160);
    if (local_170._M_array != (iterator)0x0) {
      (**(code **)((long)*local_170._M_array + 8))();
    }
  }
  if (pbStack_180 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&pbStack_180,pbStack_180);
  }
  lVar4 = std::chrono::_V2::steady_clock::now();
  local_170._M_array = (iterator)((lVar4 - (long)local_e0.__d.__r) / 1000);
  testing::internal::
  CmpHelperLE<std::chrono::duration<long,std::ratio<1l,1000000l>>,std::chrono::duration<long,std::ratio<1l,1000000l>>>
            ((internal *)local_188,"data.duration",
             "std::chrono::duration_cast<std::chrono::microseconds>(std::chrono::steady_clock::now() - start_time)"
             ,&local_80.duration,(duration<long,_std::ratio<1L,_1000000L>_> *)&local_170);
  if (local_188[0] == (internal)0x0) {
    testing::Message::Message((Message *)&local_170);
    if (pbStack_180 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar5 = "";
    }
    else {
      pcVar5 = (pbStack_180->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_160,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/bevanwsjones[P]Disa/test/solver/test_solver_utilities.cpp"
               ,0x43,pcVar5);
    testing::internal::AssertHelper::operator=(&local_160,(Message *)&local_170);
    testing::internal::AssertHelper::~AssertHelper(&local_160);
    if (local_170._M_array != (iterator)0x0) {
      (**(code **)((long)*local_170._M_array + 8))();
    }
  }
  if (pbStack_180 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&pbStack_180,pbStack_180);
  }
  testing::internal::CmpHelperEQ<double,double>
            ((internal *)local_188,"data.residual","weighted_l2_norm",&local_80.residual,
             (double *)local_158);
  if (local_188[0] == (internal)0x0) {
    testing::Message::Message((Message *)&local_170);
    if (pbStack_180 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar5 = "";
    }
    else {
      pcVar5 = (pbStack_180->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_160,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/bevanwsjones[P]Disa/test/solver/test_solver_utilities.cpp"
               ,0x44,pcVar5);
    testing::internal::AssertHelper::operator=(&local_160,(Message *)&local_170);
    testing::internal::AssertHelper::~AssertHelper(&local_160);
    if (local_170._M_array != (iterator)0x0) {
      (**(code **)((long)*local_170._M_array + 8))();
    }
  }
  if (pbStack_180 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&pbStack_180,pbStack_180);
  }
  testing::internal::CmpHelperEQ<double,double>
            ((internal *)local_188,"data.residual_max","l_inf_norm",&local_80.residual_max,
             (double *)&pbStack_150);
  if (local_188[0] == (internal)0x0) {
    testing::Message::Message((Message *)&local_170);
    if (pbStack_180 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar5 = "";
    }
    else {
      pcVar5 = (pbStack_180->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_160,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/bevanwsjones[P]Disa/test/solver/test_solver_utilities.cpp"
               ,0x45,pcVar5);
    testing::internal::AssertHelper::operator=(&local_160,(Message *)&local_170);
    testing::internal::AssertHelper::~AssertHelper(&local_160);
    if (local_170._M_array != (iterator)0x0) {
      (**(code **)((long)*local_170._M_array + 8))();
    }
  }
  if (pbStack_180 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&pbStack_180,pbStack_180);
  }
  testing::internal::CmpHelperEQ<double,double>
            ((internal *)local_188,"data.residual_0","weighted_l2_norm_0",&local_80.residual_0,
             &local_f0);
  if (local_188[0] == (internal)0x0) {
    testing::Message::Message((Message *)&local_170);
    if (pbStack_180 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar5 = "";
    }
    else {
      pcVar5 = (pbStack_180->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_160,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/bevanwsjones[P]Disa/test/solver/test_solver_utilities.cpp"
               ,0x46,pcVar5);
    testing::internal::AssertHelper::operator=(&local_160,(Message *)&local_170);
    testing::internal::AssertHelper::~AssertHelper(&local_160);
    if (local_170._M_array != (iterator)0x0) {
      (**(code **)((long)*local_170._M_array + 8))();
    }
  }
  if (pbStack_180 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&pbStack_180,pbStack_180);
  }
  testing::internal::CmpHelperEQ<double,double>
            ((internal *)local_188,"data.residual_max_0","l_inf_norm_0",&local_80.residual_max_0,
             &local_e8);
  if (local_188[0] == (internal)0x0) {
    testing::Message::Message((Message *)&local_170);
    if (pbStack_180 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar5 = "";
    }
    else {
      pcVar5 = (pbStack_180->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_160,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/bevanwsjones[P]Disa/test/solver/test_solver_utilities.cpp"
               ,0x47,pcVar5);
    testing::internal::AssertHelper::operator=(&local_160,(Message *)&local_170);
    testing::internal::AssertHelper::~AssertHelper(&local_160);
    if (local_170._M_array != (iterator)0x0) {
      (**(code **)((long)*local_170._M_array + 8))();
    }
  }
  if (pbStack_180 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&pbStack_180,pbStack_180);
  }
  local_170._M_array = (iterator)((double)local_158 / local_f0);
  testing::internal::CmpHelperEQ<double,double>
            ((internal *)local_188,"data.residual_normalised",
             "weighted_l2_norm / weighted_l2_norm_0",&local_80.residual_normalised,
             (double *)&local_170);
  if (local_188[0] == (internal)0x0) {
    testing::Message::Message((Message *)&local_170);
    if (pbStack_180 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar5 = "";
    }
    else {
      pcVar5 = (pbStack_180->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_160,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/bevanwsjones[P]Disa/test/solver/test_solver_utilities.cpp"
               ,0x48,pcVar5);
    testing::internal::AssertHelper::operator=(&local_160,(Message *)&local_170);
    testing::internal::AssertHelper::~AssertHelper(&local_160);
    if (local_170._M_array != (iterator)0x0) {
      (**(code **)((long)*local_170._M_array + 8))();
    }
  }
  if (pbStack_180 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&pbStack_180,pbStack_180);
  }
  local_170._M_array = (iterator)((double)pbStack_150 / local_e8);
  testing::internal::CmpHelperEQ<double,double>
            ((internal *)local_188,"data.residual_max_normalised","l_inf_norm / l_inf_norm_0",
             &local_80.residual_max_normalised,(double *)&local_170);
  if (local_188[0] == (internal)0x0) {
    testing::Message::Message((Message *)&local_170);
    if (pbStack_180 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar5 = "";
    }
    else {
      pcVar5 = (pbStack_180->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_160,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/bevanwsjones[P]Disa/test/solver/test_solver_utilities.cpp"
               ,0x49,pcVar5);
    testing::internal::AssertHelper::operator=(&local_160,(Message *)&local_170);
    testing::internal::AssertHelper::~AssertHelper(&local_160);
    if (local_170._M_array != (iterator)0x0) {
      (**(code **)((long)*local_170._M_array + 8))();
    }
  }
  if (pbStack_180 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&pbStack_180,pbStack_180);
  }
  if ((basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)
      local_108.super_vector<double,_std::allocator<double>_>.
      super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data._M_start
      != (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    operator_delete(local_108.super_vector<double,_std::allocator<double>_>.
                    super__Vector_base<double,_std::allocator<double>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_108.super_vector<double,_std::allocator<double>_>.
                          super__Vector_base<double,_std::allocator<double>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_108.super_vector<double,_std::allocator<double>_>.
                          super__Vector_base<double,_std::allocator<double>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  if (local_128.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
      _M_start != (pointer)0x0) {
    operator_delete(local_128.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_128.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_128.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  Disa::Matrix_Sparse::~Matrix_Sparse((Matrix_Sparse *)local_d8);
  return;
}

Assistant:

TEST(solver_utilites, update_convergence) {

  auto start_time = std::chrono::steady_clock::now();
  Convergence_Data data;
  // Test that which must be correct after instantiation.
  EXPECT_EQ(data.iteration, 0);
  EXPECT_GT(data.start_time, start_time);

  // construct system
  Matrix_Sparse matrix_sparse(5, 5);
  matrix_sparse[0][0] = 0.5;
  matrix_sparse[1][1] = 0.5;
  matrix_sparse[2][2] = 0.5;
  matrix_sparse[3][3] = 0.5;
  matrix_sparse[4][4] = 0.5;
  Vector_Dense<Scalar, 0> solution;
  solution.resize(5, 2.0);
  Vector_Dense<Scalar, 0> constant = {3.0, -1.0, 3.0, -1.0, 3.0};
  auto [weighted_l2_norm_0, l_inf_norm_0] = compute_residual(matrix_sparse, solution, constant);

  // Test that which must be correct after instantiation.
  data.update(matrix_sparse, solution, constant);
  EXPECT_EQ(data.iteration, 1);
  EXPECT_LE(data.duration,
            std::chrono::duration_cast<std::chrono::microseconds>(std::chrono::steady_clock::now() - start_time));
  EXPECT_EQ(data.residual, weighted_l2_norm_0);
  EXPECT_EQ(data.residual_max, l_inf_norm_0);
  EXPECT_EQ(data.residual_0, weighted_l2_norm_0);
  EXPECT_EQ(data.residual_max_0, l_inf_norm_0);
  EXPECT_EQ(data.residual_normalised, 1.0);
  EXPECT_EQ(data.residual_max_normalised, 1.0);

  // Second iteration, check  that which must be correct after instantiation.
  constant = Vector_Dense<Scalar, 0>({2.0, 0.0, 3.0, 0.0, 2.0});
  auto [weighted_l2_norm, l_inf_norm] = compute_residual(matrix_sparse, solution, constant);

  data.update(matrix_sparse, solution, constant);
  EXPECT_EQ(data.iteration, 2);
  EXPECT_LE(data.duration,
            std::chrono::duration_cast<std::chrono::microseconds>(std::chrono::steady_clock::now() - start_time));
  EXPECT_EQ(data.residual, weighted_l2_norm);
  EXPECT_EQ(data.residual_max, l_inf_norm);
  EXPECT_EQ(data.residual_0, weighted_l2_norm_0);
  EXPECT_EQ(data.residual_max_0, l_inf_norm_0);
  EXPECT_EQ(data.residual_normalised, weighted_l2_norm / weighted_l2_norm_0);
  EXPECT_EQ(data.residual_max_normalised, l_inf_norm / l_inf_norm_0);
}